

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssutil.cpp
# Opt level: O0

void qDrawEdge(QPainter *p,qreal x1,qreal y1,qreal x2,qreal y2,qreal dw1,qreal dw2,Edge edge,
              BorderStyle style,QBrush *c)

{
  QColor color;
  int iVar1;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  QBrush *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  int wby2;
  int dw2by2;
  int dw1by2;
  BorderStyle s2;
  BorderStyle s1;
  int dw2by3;
  int dw1by3;
  int wby3;
  qreal width;
  array<QPointF,_4UL> quad;
  QRectF *in_stack_fffffffffffff8c8;
  undefined4 in_stack_fffffffffffff8d0;
  int in_stack_fffffffffffff8d4;
  QBrush *this;
  undefined4 in_stack_fffffffffffff8d8;
  BorderStyle in_stack_fffffffffffff8dc;
  array<QPointF,_4UL> *in_stack_fffffffffffff8e0;
  QColor *in_stack_fffffffffffff8e8;
  QLineF *in_stack_fffffffffffff8f0;
  QPainter *in_stack_fffffffffffff8f8;
  PenStyle style_00;
  QBrush *in_stack_fffffffffffff948;
  QBrush *local_2f0;
  QPainter *p_00;
  QRectF local_188;
  QColor local_168;
  undefined8 local_158;
  undefined4 local_150;
  undefined2 uStack_14c;
  QPointF local_148;
  QPointF QStack_138;
  QPointF QStack_128;
  QPointF QStack_118;
  QPointF local_108;
  QPointF QStack_f8;
  QPointF QStack_e8;
  QPointF QStack_d8;
  QPointF local_c8;
  QPointF QStack_b8;
  QPointF QStack_a8;
  QPointF QStack_98;
  QPointF local_88;
  QPointF QStack_78;
  QPointF QStack_68;
  QPointF QStack_58;
  array<QPointF,_4UL> local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  p_00 = (QPainter *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  QPainter::save(in_stack_fffffffffffff8f8);
  style_00 = (PenStyle)((ulong)in_stack_fffffffffffff8f8 >> 0x20);
  if ((in_ESI == 0) || (in_ESI == 2)) {
    local_2f0 = (QBrush *)(in_XMM3_Qa - in_XMM1_Qa);
  }
  else {
    local_2f0 = (QBrush *)(in_XMM2_Qa - (double)p_00);
  }
  if (((double)local_2f0 <= 2.0) && (in_EDX == 5)) {
    in_EDX = 4;
  }
  switch(in_EDX) {
  case 2:
  case 3:
  case 6:
  case 7:
    qPenFromStyle((QBrush *)in_stack_fffffffffffff8e8,(qreal)in_stack_fffffffffffff8e0,
                  in_stack_fffffffffffff8dc);
    QPainter::setPen((QPainter *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                     (QPen *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    QPen::~QPen((QPen *)0xa2580f);
    if (((double)local_2f0 != 1.0) || (NAN((double)local_2f0))) {
      if ((in_ESI == 0) || (in_ESI == 2)) {
        QLineF::QLineF(in_stack_fffffffffffff8f0,(qreal)in_stack_fffffffffffff8e8,
                       (qreal)in_stack_fffffffffffff8e0,
                       (qreal)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                       (qreal)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        QPainter::drawLine((QPainter *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                           ,(QLineF *)in_stack_fffffffffffff8c8);
      }
      else {
        QLineF::QLineF(in_stack_fffffffffffff8f0,(qreal)in_stack_fffffffffffff8e8,
                       (qreal)in_stack_fffffffffffff8e0,
                       (qreal)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                       (qreal)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        QPainter::drawLine((QPainter *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                           ,(QLineF *)in_stack_fffffffffffff8c8);
      }
    }
    else {
      QLineF::QLineF(in_stack_fffffffffffff8f0,(qreal)in_stack_fffffffffffff8e8,
                     (qreal)in_stack_fffffffffffff8e0,
                     (qreal)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                     (qreal)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      QPainter::drawLine((QPainter *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                         (QLineF *)in_stack_fffffffffffff8c8);
    }
    break;
  case 5:
    qRound(5.2568298159434e-317);
    qRound(5.25684661417536e-317);
    qRound(5.25686341240732e-317);
    switch(in_ESI) {
    case 0:
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa25bc0);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa25ce9);
      break;
    case 1:
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa26250);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa2637c);
      break;
    case 2:
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa2604b);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa2614b);
      break;
    case 3:
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa25dee);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa25f1a);
    }
    break;
  case 8:
  case 9:
    qFloor<double>(5.25805509874509e-317);
    qFloor<double>(5.25807189697705e-317);
    iVar1 = qRound(5.25808869520901e-317);
    switch(in_ESI) {
    case 0:
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa26580);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa266a7);
      break;
    case 1:
      this = (QBrush *)((double)p_00 + (double)iVar1);
      QBrush::QBrush(this,in_RDI);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa26c08);
      QBrush::QBrush(this,in_RDI);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa26d02);
      break;
    case 2:
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa267bc);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa268e6);
      break;
    case 3:
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa269fb);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (QBrush *)in_stack_fffffffffffff8c8);
      qDrawEdge(p_00,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,in_XMM4_Qa,in_XMM5_Qa,
                (qreal)CONCAT44(in_ESI,in_EDX),(Edge)((ulong)in_RCX >> 0x20),(BorderStyle)in_RCX,
                local_2f0);
      QBrush::~QBrush((QBrush *)0xa26b25);
      in_stack_fffffffffffff948 = in_RDI;
    }
    break;
  case 10:
  case 0xb:
    if (((in_EDX == 0xb) && ((in_ESI == 0 || (in_ESI == 3)))) ||
       ((in_EDX == 10 && ((in_ESI == 2 || (in_ESI == 1)))))) {
      QBrush::color((QBrush *)0xa252be);
      local_168 = QColor::lighter(in_stack_fffffffffffff8e8,
                                  (int)((ulong)in_stack_fffffffffffff8e0 >> 0x20));
      local_158 = local_168._0_8_;
      local_150 = local_168.ct._4_4_;
      uStack_14c = local_168.ct._8_2_;
      color.ct._0_4_ = in_stack_fffffffffffff8d4;
      color.cspec = in_stack_fffffffffffff8d0;
      color.ct._4_4_ = in_stack_fffffffffffff8d8;
      color._12_4_ = in_stack_fffffffffffff8dc;
      QBrush::operator=((QBrush *)in_stack_fffffffffffff8c8,color);
    }
  case 4:
    QPainter::setPen((QPainter *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     style_00);
    QPainter::setBrush((QPainter *)in_stack_fffffffffffff8e8,(QBrush *)in_stack_fffffffffffff8e0);
    if ((((double)local_2f0 == 1.0) && (!NAN((double)local_2f0))) ||
       ((in_XMM4_Qa == 0.0 && (((!NAN(in_XMM4_Qa) && (in_XMM5_Qa == 0.0)) && (!NAN(in_XMM5_Qa)))))))
    {
      QRectF::QRectF(&local_188,(qreal)p_00,in_XMM1_Qa,in_XMM2_Qa - (double)p_00,
                     in_XMM3_Qa - in_XMM1_Qa);
      QPainter::drawRect((QPainter *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                         in_stack_fffffffffffff8c8);
    }
    else {
      local_48._M_elems[3].xp._0_4_ = 0xffffffff;
      local_48._M_elems[3].xp._4_4_ = 0xffffffff;
      local_48._M_elems[3].yp._0_4_ = 0xffffffff;
      local_48._M_elems[3].yp._4_4_ = 0xffffffff;
      local_48._M_elems[2].xp._0_4_ = 0xffffffff;
      local_48._M_elems[2].xp._4_4_ = 0xffffffff;
      local_48._M_elems[2].yp._0_4_ = 0xffffffff;
      local_48._M_elems[2].yp._4_4_ = 0xffffffff;
      local_48._M_elems[1].xp._0_4_ = 0xffffffff;
      local_48._M_elems[1].xp._4_4_ = 0xffffffff;
      local_48._M_elems[1].yp._0_4_ = 0xffffffff;
      local_48._M_elems[1].yp._4_4_ = 0xffffffff;
      local_48._M_elems[0].xp._0_4_ = 0xffffffff;
      local_48._M_elems[0].xp._4_4_ = 0xffffffff;
      local_48._M_elems[0].yp._0_4_ = 0xffffffff;
      local_48._M_elems[0].yp._4_4_ = 0xffffffff;
      std::array<QPointF,_4UL>::array(in_stack_fffffffffffff8e0);
      switch(in_ESI) {
      case 0:
        QPointF::QPointF(&local_88,(qreal)p_00,in_XMM1_Qa);
        QPointF::QPointF(&QStack_78,(double)p_00 + in_XMM4_Qa,in_XMM3_Qa);
        QPointF::QPointF(&QStack_68,in_XMM2_Qa - in_XMM5_Qa,in_XMM3_Qa);
        QPointF::QPointF(&QStack_58,in_XMM2_Qa,in_XMM1_Qa);
        memcpy(&local_48,&local_88,0x40);
        break;
      case 1:
        QPointF::QPointF(&local_148,(qreal)p_00,in_XMM1_Qa + in_XMM4_Qa);
        QPointF::QPointF(&QStack_138,(qreal)p_00,in_XMM3_Qa - in_XMM5_Qa);
        QPointF::QPointF(&QStack_128,in_XMM2_Qa,in_XMM3_Qa);
        QPointF::QPointF(&QStack_118,in_XMM2_Qa,in_XMM1_Qa);
        memcpy(&local_48,&local_148,0x40);
        break;
      case 2:
        QPointF::QPointF(&local_c8,(double)p_00 + in_XMM4_Qa,in_XMM1_Qa);
        QPointF::QPointF(&QStack_b8,(qreal)p_00,in_XMM3_Qa);
        QPointF::QPointF(&QStack_a8,in_XMM2_Qa,in_XMM3_Qa);
        QPointF::QPointF(&QStack_98,in_XMM2_Qa - in_XMM5_Qa,in_XMM1_Qa);
        memcpy(&local_48,&local_c8,0x40);
        break;
      case 3:
        QPointF::QPointF(&local_108,(qreal)p_00,in_XMM1_Qa);
        QPointF::QPointF(&QStack_f8,(qreal)p_00,in_XMM3_Qa);
        QPointF::QPointF(&QStack_e8,in_XMM2_Qa,in_XMM3_Qa - in_XMM5_Qa);
        QPointF::QPointF(&QStack_d8,in_XMM2_Qa,in_XMM1_Qa + in_XMM4_Qa);
        memcpy(&local_48,&local_108,0x40);
      }
      std::array<QPointF,_4UL>::data((array<QPointF,_4UL> *)0xa25787);
      std::array<QPointF,_4UL>::size(&local_48);
      QPainter::drawConvexPolygon
                ((QPainter *)in_stack_fffffffffffff8e0,
                 (QPointF *)CONCAT44(in_stack_fffffffffffff8dc,in_stack_fffffffffffff8d8),
                 in_stack_fffffffffffff8d4);
    }
  }
  QPainter::restore((QPainter *)in_stack_fffffffffffff948);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void qDrawEdge(QPainter *p, qreal x1, qreal y1, qreal x2, qreal y2, qreal dw1, qreal dw2,
               QCss::Edge edge, QCss::BorderStyle style, QBrush c)
{
    p->save();
    const qreal width = (edge == TopEdge || edge == BottomEdge) ? (y2-y1) : (x2-x1);

    if (width <= 2 && style == BorderStyle_Double)
        style = BorderStyle_Solid;

    switch (style) {
    case BorderStyle_Inset:
    case BorderStyle_Outset:
        if ((style == BorderStyle_Outset && (edge == TopEdge || edge == LeftEdge))
            || (style == BorderStyle_Inset && (edge == BottomEdge || edge == RightEdge)))
            c = c.color().lighter();
        Q_FALLTHROUGH();
    case BorderStyle_Solid: {
        p->setPen(Qt::NoPen);
        p->setBrush(c);
        if (width == 1 || (dw1 == 0 && dw2 == 0)) {
            p->drawRect(QRectF(x1, y1, x2-x1, y2-y1));
        } else { // draw trapezoid
            std::array<QPointF, 4> quad;
            switch (edge) {
            case TopEdge:
                quad = {QPointF(x1, y1), QPointF(x1 + dw1, y2),
                        QPointF(x2 - dw2, y2), QPointF(x2, y1)};
                break;
            case BottomEdge:
                quad = {QPointF(x1 + dw1, y1), QPointF(x1, y2),
                        QPointF(x2, y2), QPointF(x2 - dw2, y1)};
                break;
            case LeftEdge:
                quad = {QPointF(x1, y1), QPointF(x1, y2),
                        QPointF(x2, y2 - dw2), QPointF(x2, y1 + dw1)};
                break;
            case RightEdge:
                quad = {QPointF(x1, y1 + dw1), QPointF(x1, y2 - dw2),
                        QPointF(x2, y2), QPointF(x2, y1)};
                break;
            default:
                break;
            }
            p->drawConvexPolygon(quad.data(), static_cast<int>(quad.size()));
        }
        break;
    }
    case BorderStyle_Dotted:
    case BorderStyle_Dashed:
    case BorderStyle_DotDash:
    case BorderStyle_DotDotDash:
        p->setPen(qPenFromStyle(c, width, style));
        if (width == 1)
            p->drawLine(QLineF(x1, y1, x2 - 1, y2 - 1));
        else if (edge == TopEdge || edge == BottomEdge)
            p->drawLine(QLineF(x1 + width/2, (y1 + y2)/2, x2 - width/2, (y1 + y2)/2));
        else
            p->drawLine(QLineF((x1+x2)/2, y1 + width/2, (x1+x2)/2, y2 - width/2));
        break;

    case BorderStyle_Double: {
        int wby3 = qRound(width/3);
        int dw1by3 = qRound(dw1/3);
        int dw2by3 = qRound(dw2/3);
        switch (edge) {
        case TopEdge:
            qDrawEdge(p, x1, y1, x2, y1 + wby3, dw1by3, dw2by3, TopEdge, BorderStyle_Solid, c);
            qDrawEdge(p, x1 + dw1 - dw1by3, y2 - wby3, x2 - dw2 + dw1by3, y2,
                      dw1by3, dw2by3, TopEdge, BorderStyle_Solid, c);
            break;
        case LeftEdge:
            qDrawEdge(p, x1, y1, x1 + wby3, y2, dw1by3, dw2by3, LeftEdge, BorderStyle_Solid, c);
            qDrawEdge(p, x2 - wby3, y1 + dw1 - dw1by3, x2, y2 - dw2 + dw2by3, dw1by3, dw2by3,
                      LeftEdge, BorderStyle_Solid, c);
            break;
        case BottomEdge:
            qDrawEdge(p, x1 + dw1 - dw1by3, y1, x2 - dw2 + dw2by3, y1 + wby3, dw1by3, dw2by3,
                      BottomEdge, BorderStyle_Solid, c);
            qDrawEdge(p, x1, y2 - wby3, x2, y2, dw1by3, dw2by3, BottomEdge, BorderStyle_Solid, c);
            break;
        case RightEdge:
            qDrawEdge(p, x2 - wby3, y1, x2, y2, dw1by3, dw2by3, RightEdge, BorderStyle_Solid, c);
            qDrawEdge(p, x1, y1 + dw1 - dw1by3, x1 + wby3, y2 - dw2 + dw2by3, dw1by3, dw2by3,
                      RightEdge, BorderStyle_Solid, c);
            break;
        default:
            break;
        }
        break;
    }
    case BorderStyle_Ridge:
    case BorderStyle_Groove: {
        BorderStyle s1, s2;
        if (style == BorderStyle_Groove) {
            s1 = BorderStyle_Inset;
            s2 = BorderStyle_Outset;
        } else {
            s1 = BorderStyle_Outset;
            s2 = BorderStyle_Inset;
        }
        int dw1by2 = qFloor(dw1/2), dw2by2 = qFloor(dw2/2);
        int wby2 = qRound(width/2);
        switch (edge) {
        case TopEdge:
            qDrawEdge(p, x1, y1, x2, y1 + wby2, dw1by2, dw2by2, TopEdge, s1, c);
            qDrawEdge(p, x1 + dw1by2, y1 + wby2, x2 - dw2by2, y2, dw1by2, dw2by2, TopEdge, s2, c);
            break;
        case BottomEdge:
            qDrawEdge(p, x1, y1 + wby2, x2, y2, dw1by2, dw2by2, BottomEdge, s1, c);
            qDrawEdge(p, x1 + dw1by2, y1, x2 - dw2by2, y1 + wby2, dw1by2, dw2by2, BottomEdge, s2, c);
            break;
        case LeftEdge:
            qDrawEdge(p, x1, y1, x1 + wby2, y2, dw1by2, dw2by2, LeftEdge, s1, c);
            qDrawEdge(p, x1 + wby2, y1 + dw1by2, x2, y2 - dw2by2, dw1by2, dw2by2, LeftEdge, s2, c);
            break;
        case RightEdge:
            qDrawEdge(p, x1 + wby2, y1, x2, y2, dw1by2, dw2by2, RightEdge, s1, c);
            qDrawEdge(p, x1, y1 + dw1by2, x1 + wby2, y2 - dw2by2, dw1by2, dw2by2, RightEdge, s2, c);
            break;
        default:
            break;
        }
        break;
    }
    default:
        break;
    }
    p->restore();
}